

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DefaultCaseItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultCaseItemSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SyntaxNode&>
          (BumpAllocator *this,Token *args,Token *args_1,SyntaxNode *args_2)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  DefaultCaseItemSyntax *pDVar11;
  
  pDVar11 = (DefaultCaseItemSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DefaultCaseItemSyntax *)this->endPtr < pDVar11 + 1) {
    pDVar11 = (DefaultCaseItemSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pDVar11 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar2 = args_1->info;
  (pDVar11->super_CaseItemSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pDVar11->super_CaseItemSyntax).super_SyntaxNode.kind = DefaultCaseItem;
  (pDVar11->defaultKeyword).kind = TVar3;
  (pDVar11->defaultKeyword).field_0x2 = uVar4;
  (pDVar11->defaultKeyword).numFlags = (NumericTokenFlags)NVar5.raw;
  (pDVar11->defaultKeyword).rawLen = uVar6;
  (pDVar11->defaultKeyword).info = pIVar1;
  (pDVar11->colon).kind = TVar7;
  (pDVar11->colon).field_0x2 = uVar8;
  (pDVar11->colon).numFlags = (NumericTokenFlags)NVar9.raw;
  (pDVar11->colon).rawLen = uVar10;
  (pDVar11->colon).info = pIVar2;
  (pDVar11->clause).ptr = args_2;
  args_2->parent = (SyntaxNode *)pDVar11;
  return pDVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }